

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O0

void __thiscall
Rml::GeometryBackgroundBorder::DrawPointPoint
          (GeometryBackgroundBorder *this,Vector2f pos_outer,Vector2f pos_inner,
          ColourbPremultiplied color0,ColourbPremultiplied color1)

{
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  bool bVar1;
  size_type sVar2;
  bool different_color;
  GeometryBackgroundBorder *this_local;
  ColourbPremultiplied color1_local;
  ColourbPremultiplied color0_local;
  Vector2f pos_inner_local;
  Vector2f pos_outer_local;
  
  this_local._0_4_ = color1;
  this_local._4_4_ = color0;
  _color1_local = pos_inner;
  bVar1 = Colour<unsigned_char,_255,_true>::operator!=
                    ((Colour<unsigned_char,_255,_true> *)((long)&this_local + 4),color1);
  this_00 = this->vertices;
  sVar2 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(this_00);
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
            (this_00,(long)(int)((int)sVar2 + 2 + (uint)bVar1 * 2));
  DrawPoint(this,_color1_local,this_local._4_4_);
  DrawPoint(this,pos_outer,this_local._4_4_);
  if (bVar1) {
    DrawPoint(this,_color1_local,this_local._0_4_);
    DrawPoint(this,pos_outer,this_local._0_4_);
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawPointPoint(Vector2f pos_outer, Vector2f pos_inner, ColourbPremultiplied color0, ColourbPremultiplied color1)
{
	const bool different_color = (color0 != color1);

	vertices.reserve((int)vertices.size() + (different_color ? 4 : 2));

	DrawPoint(pos_inner, color0);
	DrawPoint(pos_outer, color0);

	if (different_color)
	{
		DrawPoint(pos_inner, color1);
		DrawPoint(pos_outer, color1);
	}
}